

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O1

Vec_Vec_t * Ivy_ManLevelize(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint *puVar4;
  uint uVar5;
  Vec_Vec_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  undefined8 *puVar9;
  void *pvVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar13];
      if (pvVar3 != (void *)0x0) {
        uVar5 = *(uint *)((long)pvVar3 + 8) & 0xf;
        if (uVar5 == 7) {
          __assert_fail("!Ivy_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                        ,0xe8,"Vec_Vec_t *Ivy_ManLevelize(Ivy_Man_t *)");
        }
        if (0xfffffffd < uVar5 - 7) {
          uVar5 = *(uint *)((long)pvVar3 + 8) >> 0xb;
          iVar2 = pVVar6->nSize;
          if (iVar2 <= (int)uVar5) {
            iVar1 = uVar5 + 1;
            if (pVVar6->nCap <= (int)uVar5) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)(uint)(iVar1 * 8));
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)(uint)(iVar1 * 8));
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = iVar1;
            }
            ppvVar7 = pVVar6->pArray;
            lVar12 = 0;
            do {
              puVar9 = (undefined8 *)malloc(0x10);
              *puVar9 = 0;
              puVar9[1] = 0;
              ppvVar7[iVar2 + lVar12] = puVar9;
              lVar12 = lVar12 + 1;
            } while ((uVar5 - iVar2) + 1 != (int)lVar12);
            pVVar6->nSize = iVar1;
          }
          if (pVVar6->nSize <= (int)uVar5) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          puVar4 = (uint *)pVVar6->pArray[uVar5];
          uVar5 = *puVar4;
          if (puVar4[1] == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (*(void **)(puVar4 + 2) == (void *)0x0) {
                pvVar10 = malloc(0x80);
              }
              else {
                pvVar10 = realloc(*(void **)(puVar4 + 2),0x80);
              }
              *(void **)(puVar4 + 2) = pvVar10;
              uVar11 = 0x10;
            }
            else {
              uVar11 = uVar5 * 2;
              if ((int)uVar11 <= (int)uVar5) goto LAB_007d0488;
              if (*(void **)(puVar4 + 2) == (void *)0x0) {
                pvVar10 = malloc((ulong)uVar5 << 4);
              }
              else {
                pvVar10 = realloc(*(void **)(puVar4 + 2),(ulong)uVar5 << 4);
              }
              *(void **)(puVar4 + 2) = pvVar10;
            }
            *puVar4 = uVar11;
          }
LAB_007d0488:
          uVar5 = puVar4[1];
          puVar4[1] = uVar5 + 1;
          *(void **)(*(long *)(puVar4 + 2) + (long)(int)uVar5 * 8) = pvVar3;
        }
      }
      lVar13 = lVar13 + 1;
      pVVar8 = p->vObjs;
    } while (lVar13 < pVVar8->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Vec_t * Ivy_ManLevelize( Ivy_Man_t * p )
{
    Vec_Vec_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    vNodes = Vec_VecAlloc( 100 );
    Ivy_ManForEachObj( p, pObj, i )
    {
        assert( !Ivy_ObjIsBuf(pObj) );
        if ( Ivy_ObjIsNode(pObj) )
            Vec_VecPush( vNodes, pObj->Level, pObj );
    }
    return vNodes;
}